

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::Parser
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,ScriptContext *scriptContext,
          ArenaAllocator *ctAllocator,StandardChars<unsigned_char> *standardEncodedChars,
          StandardChars<char16_t> *standardChars,bool isUtf8,DebugWriter *w)

{
  bool isUtf8_local;
  StandardChars<char16_t> *standardChars_local;
  StandardChars<unsigned_char> *standardEncodedChars_local;
  ArenaAllocator *ctAllocator_local;
  ScriptContext *scriptContext_local;
  Parser<UTF8EncodingPolicyBase<false>,_false> *this_local;
  
  UTF8EncodingPolicyBase<false>::UTF8EncodingPolicyBase(&this->super_UTF8EncodingPolicyBase<false>);
  this->scriptContext = scriptContext;
  this->ctAllocator = ctAllocator;
  this->standardEncodedChars = standardEncodedChars;
  this->standardChars = standardChars;
  this->w = w;
  this->input = (EncodedChar *)0x0;
  this->inputLim = (EncodedChar *)0x0;
  this->next = (EncodedChar *)0x0;
  this->inBody = false;
  this->numGroups = 1;
  this->nextGroupId = 1;
  this->litbuf = (Char *)0x0;
  this->litbufLen = 0;
  this->litbufNext = 0;
  this->surrogatePairList = (SurrogatePairTracker *)0x0;
  this->currentSurrogatePairNode = (SurrogatePairTracker *)0x0;
  this->unicodeFlagPresent = false;
  this->caseInsensitiveFlagPresent = false;
  this->dotAllFlagPresent = false;
  this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
  this->tempLocationOfRange = (EncodedChar *)0x0;
  this->codePointAtTempLocation = 0;
  this->positionAfterLastSurrogate = (EncodedChar *)0x0;
  this->valueOfLastSurrogate = 0xffffffff;
  this->deferredIfNotUnicodeError = (ParseError *)0x0;
  this->deferredIfUnicodeError = (ParseError *)0x0;
  UTF8EncodingPolicyBase<false>::SetIsUtf8(&this->super_UTF8EncodingPolicyBase<false>,isUtf8);
  return;
}

Assistant:

Parser<P, IsLiteral>::Parser
        ( Js::ScriptContext* scriptContext
        , ArenaAllocator* ctAllocator
        , StandardChars<EncodedChar>* standardEncodedChars
        , StandardChars<Char>* standardChars
        , bool isUtf8
#if ENABLE_REGEX_CONFIG_OPTIONS
        , DebugWriter* w
#endif
        )
        : scriptContext(scriptContext)
        , ctAllocator(ctAllocator)
        , standardEncodedChars(standardEncodedChars)
        , standardChars(standardChars)
#if ENABLE_REGEX_CONFIG_OPTIONS
        , w(w)
#endif
        , input(0)
        , inputLim(0)
        , next(0)
        , inBody(false)
        , numGroups(1)
        , nextGroupId(1) // implicit overall group always takes index 0
        , litbuf(0)
        , litbufLen(0)
        , litbufNext(0)
        , surrogatePairList(nullptr)
        , currentSurrogatePairNode(nullptr)
        , tempLocationOfSurrogatePair(nullptr)
        , tempLocationOfRange(nullptr)
        , codePointAtTempLocation(0)
        , unicodeFlagPresent(false)
        , dotAllFlagPresent(false)
        , caseInsensitiveFlagPresent(false)
        , positionAfterLastSurrogate(nullptr)
        , valueOfLastSurrogate(INVALID_CODEPOINT)
        , deferredIfNotUnicodeError(nullptr)
        , deferredIfUnicodeError(nullptr)
    {
        this->SetIsUtf8(isUtf8);
    }